

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocale.cpp
# Opt level: O3

QDebug operator<<(QDebug dbg,QLocale *l)

{
  uint uVar1;
  DataPointer *pDVar2;
  QArrayData *pQVar3;
  long *in_RDX;
  char *pcVar4;
  QString *pQVar5;
  QLocalePrivate *pQVar6;
  long in_FS_OFFSET;
  bool bVar7;
  QByteArrayView ba;
  QByteArrayView ba_00;
  QByteArrayView ba_01;
  QByteArrayView ba_02;
  QDebugStateSaver saver;
  QString local_98;
  QString local_80;
  QString local_68;
  QDebugStateSaver local_50;
  QString local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_50.d._M_t.
  super___uniq_ptr_impl<QDebugStateSaverPrivate,_std::default_delete<QDebugStateSaverPrivate>_>._M_t
  .super__Tuple_impl<0UL,_QDebugStateSaverPrivate_*,_std::default_delete<QDebugStateSaverPrivate>_>.
  super__Head_base<0UL,_QDebugStateSaverPrivate_*,_false>._M_head_impl =
       (unique_ptr<QDebugStateSaverPrivate,_std::default_delete<QDebugStateSaverPrivate>_>)
       &DAT_aaaaaaaaaaaaaaaa;
  QDebugStateSaver::QDebugStateSaver(&local_50,(QDebug *)l);
  systemData(&QLocale::system::locale.m_index);
  QLocale::system::locale.m_numberOptions.super_QFlagsStorageHelper<QLocale::NumberOption,_4>.
  super_QFlagsStorage<QLocale::NumberOption>.i._1_3_ = 0;
  QLocale::system::locale.m_numberOptions.super_QFlagsStorageHelper<QLocale::NumberOption,_4>.
  super_QFlagsStorage<QLocale::NumberOption>.i._0_1_ =
       (QLocale::system::locale.m_data)->m_language_id == 1;
  QLocale::QLocale((QLocale *)&local_48,&QLocale::system::locale);
  if (*(long *)*in_RDX == *(long *)local_48.d.d) {
    uVar1 = (uint)local_48.d.d[1].super_QArrayData.alloc;
    pQVar3 = (QArrayData *)(ulong)uVar1;
    bVar7 = *(uint *)((long *)*in_RDX + 3) == uVar1;
  }
  else {
    bVar7 = false;
    pQVar3 = &(local_48.d.d)->super_QArrayData;
  }
  QLocale::~QLocale((QLocale *)&local_48);
  pQVar6 = (l->d).d.ptr;
  *(undefined2 *)&pQVar6[1].m_index = 0x100;
  pcVar4 = "QLocale(";
  if (bVar7) {
    pcVar4 = "QLocale::system()/* ";
  }
  pQVar5 = (QString *)0xffffffffffffffff;
  do {
    pDVar2 = &pQVar5->d;
    pQVar5 = (QString *)((long)&(pQVar5->d).d + 1);
  } while ((pcVar4 + 1)[(long)&pDVar2->d] != '\0');
  ba.m_data = (storage_type *)pQVar3;
  ba.m_size = (qsizetype)pcVar4;
  QString::fromUtf8(&local_48,pQVar5,ba);
  QTextStream::operator<<((QTextStream *)pQVar6,&local_48);
  if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,2,0x10);
    }
  }
  pQVar6 = (l->d).d.ptr;
  if ((char)pQVar6[1].m_index == '\x01') {
    QTextStream::operator<<((QTextStream *)pQVar6,' ');
  }
  QLocale::languageToString(&local_68,**(Language **)*in_RDX);
  if ((QChar *)local_68.d.ptr == (QChar *)0x0) {
    local_68.d.ptr = &QString::_empty;
  }
  QDebug::putString((QDebug *)l,(QChar *)local_68.d.ptr,local_68.d.size);
  pQVar6 = (l->d).d.ptr;
  if ((char)pQVar6[1].m_index == '\x01') {
    QTextStream::operator<<((QTextStream *)pQVar6,' ');
    pQVar6 = (l->d).d.ptr;
  }
  ba_00.m_data = (storage_type *)pQVar3;
  ba_00.m_size = (qsizetype)", ";
  QString::fromUtf8(&local_48,(QString *)0x2,ba_00);
  QTextStream::operator<<((QTextStream *)pQVar6,&local_48);
  if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,2,0x10);
    }
  }
  pQVar6 = (l->d).d.ptr;
  if ((char)pQVar6[1].m_index == '\x01') {
    QTextStream::operator<<((QTextStream *)pQVar6,' ');
  }
  QLocale::scriptToString(&local_80,*(Script *)(*(long *)*in_RDX + 2));
  if ((QChar *)local_80.d.ptr == (QChar *)0x0) {
    local_80.d.ptr = &QString::_empty;
  }
  QDebug::putString((QDebug *)l,(QChar *)local_80.d.ptr,local_80.d.size);
  pQVar6 = (l->d).d.ptr;
  if ((char)pQVar6[1].m_index == '\x01') {
    QTextStream::operator<<((QTextStream *)pQVar6,' ');
    pQVar6 = (l->d).d.ptr;
  }
  ba_01.m_data = (storage_type *)pQVar3;
  ba_01.m_size = (qsizetype)", ";
  QString::fromUtf8(&local_48,(QString *)0x2,ba_01);
  QTextStream::operator<<((QTextStream *)pQVar6,&local_48);
  if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,2,0x10);
    }
  }
  pQVar6 = (l->d).d.ptr;
  if ((char)pQVar6[1].m_index == '\x01') {
    QTextStream::operator<<((QTextStream *)pQVar6,' ');
  }
  QLocale::territoryToString(&local_98,*(Territory *)(*(long *)*in_RDX + 4));
  if ((QChar *)local_98.d.ptr == (QChar *)0x0) {
    local_98.d.ptr = &QString::_empty;
  }
  QDebug::putString((QDebug *)l,(QChar *)local_98.d.ptr,local_98.d.size);
  pQVar6 = (l->d).d.ptr;
  if ((char)pQVar6[1].m_index == '\x01') {
    QTextStream::operator<<((QTextStream *)pQVar6,' ');
    pQVar6 = (l->d).d.ptr;
  }
  pcVar4 = ")";
  if (bVar7) {
    pcVar4 = " */";
  }
  pQVar5 = (QString *)0xffffffffffffffff;
  do {
    pDVar2 = &pQVar5->d;
    pQVar5 = (QString *)((long)&(pQVar5->d).d + 1);
  } while ((pcVar4 + 1)[(long)&pDVar2->d] != '\0');
  ba_02.m_data = (storage_type *)pQVar3;
  ba_02.m_size = (qsizetype)pcVar4;
  QString::fromUtf8(&local_48,pQVar5,ba_02);
  QTextStream::operator<<((QTextStream *)pQVar6,&local_48);
  if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,2,0x10);
    }
  }
  pQVar6 = (l->d).d.ptr;
  if ((char)pQVar6[1].m_index == '\x01') {
    QTextStream::operator<<((QTextStream *)pQVar6,' ');
  }
  if (&(local_98.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_98.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_80.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_80.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_80.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_80.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_80.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_68.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_68.d.d)->super_QArrayData,2,0x10);
    }
  }
  pQVar6 = (l->d).d.ptr;
  (l->d).d.ptr = (QLocalePrivate *)0x0;
  ((dbg.stream)->ts)._vptr_QTextStream = (_func_int **)pQVar6;
  QDebugStateSaver::~QDebugStateSaver(&local_50);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return (QDebug)dbg.stream;
  }
  __stack_chk_fail();
}

Assistant:

QDebug operator<<(QDebug dbg, const QLocale &l)
{
    QDebugStateSaver saver(dbg);
    const bool isSys = l == QLocale::system();
    dbg.nospace().noquote()
        << (isSys ? "QLocale::system()/* " : "QLocale(")
        << QLocale::languageToString(l.language()) << ", "
        << QLocale::scriptToString(l.script()) << ", "
        << QLocale::territoryToString(l.territory()) << (isSys ? " */" : ")");
    return dbg;
}